

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O3

void __thiscall
deqp::sl::ShaderCase::specializeShaders
          (ShaderCase *this,char *vertexSource,char *fragmentSource,string *outVertexSource,
          string *outFragmentSource,ValueBlock *valueBlock)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  bool bVar5;
  DataType DVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  ostream *poVar10;
  char *pcVar11;
  long lVar12;
  byte bVar13;
  long lVar14;
  long lVar15;
  pointer pVVar16;
  string *psVar17;
  bool bVar18;
  StringTemplate tmpl;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  char *fragColor;
  ostringstream decl;
  ostringstream setup;
  undefined1 auStack_3f8 [7];
  byte local_3f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  allocator<char> local_3c9;
  ValueBlock *local_3c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_380;
  char *local_350;
  char *local_348;
  char *local_340;
  string *local_338;
  string *local_330;
  char *local_328;
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  bVar18 = GLSL_VERSION_150 < this->m_targetVersion;
  bVar13 = 0xe >> ((byte)this->m_targetVersion & 0x1f);
  local_3c8 = valueBlock;
  local_338 = outFragmentSource;
  local_330 = outVertexSource;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_3f1 = bVar18 | bVar13;
  local_350 = "attribute";
  bVar5 = (bVar13 & 1) != 0;
  if (bVar18 || bVar5) {
    local_350 = "in";
  }
  lVar12 = 9;
  if (bVar18 || bVar5) {
    lVar12 = 2;
  }
  local_340 = fragmentSource;
  local_328 = vertexSource;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,local_350,lVar12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320," highp vec4 dEQP_Position;\n",0x1b);
  pVVar16 = (local_3c8->values).
            super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_3c8->values).
                              super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16) >> 3) *
          0x38e38e39) {
    lVar15 = 0x28;
    lVar14 = 0;
    do {
      pcVar7 = glu::getDataTypeName(*(DataType *)((long)&pVVar16->storageType + lVar15));
      iVar4 = *(int *)((long)pVVar16 + lVar15 + -0x28);
      if (iVar4 == 0) {
        psVar17 = (string *)((long)pVVar16 + lVar15 + -0x20);
        lVar9 = std::__cxx11::string::find((char)psVar17,0x2e);
        if (lVar9 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"uniform ",8);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)auStack_3f8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0xd8)
            ;
          }
          else {
            sVar8 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
LAB_00d9c414:
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,(psVar17->_M_dataplus)._M_p,
                               *(long *)((long)pVVar16 + lVar15 + -0x18));
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        }
      }
      else if (iVar4 == 1) {
        DVar6 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar16->storageType + lVar15));
        if (DVar6 == TYPE_FLOAT) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,local_350,lVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)auStack_3f8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0xd8)
            ;
          }
          else {
            sVar8 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
          psVar17 = &pVVar16[lVar14].valueName;
          goto LAB_00d9c414;
        }
        DVar6 = glu::getDataTypeFloatScalars(*(DataType *)((long)&pVVar16->storageType + lVar15));
        pcVar11 = glu::getDataTypeName(DVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,local_350,lVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)auStack_3f8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0xd8);
        }
        else {
          sVar8 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar11,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," a_",3);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,*(char **)((long)pVVar16 + lVar15 + -0x20),
                             *(long *)((long)pVVar16 + lVar15 + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)auStack_3f8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x250);
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,*(char **)((long)pVVar16 + lVar15 + -0x20),
                             *(long *)((long)pVVar16 + lVar15 + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(a_",3);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,*(char **)((long)pVVar16 + lVar15 + -0x20),
                             *(long *)((long)pVVar16 + lVar15 + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
      }
      lVar14 = lVar14 + 1;
      pVVar16 = (local_3c8->values).
                super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x48;
    } while (lVar14 < (int)((ulong)((long)(local_3c8->values).
                                          super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16
                                   ) >> 3) * 0x38e38e39);
  }
  local_380._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_380._M_impl.super__Rb_tree_header._M_header;
  local_380._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_380._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_380._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_380._M_impl.super__Rb_tree_header._M_header._M_right =
       local_380._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3c0,(char (*) [20])"VERTEX_DECLARATIONS",&local_3f0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_380,&local_3c0);
  bVar13 = local_3f1;
  paVar3 = &local_3c0.second.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.second._M_dataplus._M_p != paVar3) {
    operator_delete(local_3c0.second._M_dataplus._M_p,
                    local_3c0.second.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_3c0.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.first._M_dataplus._M_p,
                    local_3c0.first.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_3f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3c0,(char (*) [13])"VERTEX_SETUP",&local_3f0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_380,&local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.second._M_dataplus._M_p != paVar3) {
    operator_delete(local_3c0.second._M_dataplus._M_p,
                    local_3c0.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.first._M_dataplus._M_p,
                    local_3c0.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  local_3f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f0,"gl_Position = dEQP_Position;\n","");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3c0,(char (*) [14])"VERTEX_OUTPUT",&local_3f0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_380,&local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.second._M_dataplus._M_p != paVar3) {
    operator_delete(local_3c0.second._M_dataplus._M_p,
                    local_3c0.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.first._M_dataplus._M_p,
                    local_3c0.first.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = local_328;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,pcVar7,(allocator<char> *)&local_348);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_3c0,&local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::specialize
            (&local_3f0,(StringTemplate *)&local_3c0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_380);
  std::__cxx11::string::operator=((string *)local_330,(string *)&local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_3c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_380);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar7 = "gl_FragColor";
  if ((bVar13 & 1) != 0) {
    pcVar7 = "dEQP_FragColor";
  }
  local_348 = pcVar7;
  genCompareFunctions((sl *)local_320,
                      (ostringstream *)
                      (local_3c8->values).
                      super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ValueBlock *)
                      (local_3c8->values).
                      super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                      ._M_impl.super__Vector_impl_data._M_finish,false);
  genCompareOp((ostringstream *)local_1a8,pcVar7,local_3c8,glcts::fixed_sample_locations_values + 1,
               (char *)outFragmentSource);
  if ((bVar13 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
  }
  pVVar16 = (local_3c8->values).
            super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_3c8->values).
                              super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16) >> 3) *
          0x38e38e39) {
    lVar12 = 0;
    lVar14 = 0;
    do {
      pcVar7 = *(char **)((long)&(pVVar16->valueName)._M_dataplus._M_p + lVar12);
      pcVar11 = glu::getDataTypeName(*(DataType *)((long)&pVVar16->dataType + lVar12));
      iVar4 = *(int *)((long)&pVVar16->storageType + lVar12);
      if (iVar4 == 0) {
        lVar15 = std::__cxx11::string::find((char)pVVar16 + (char)lVar12 + '\b',0x2e);
        if (lVar15 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"uniform ",8);
          if (pcVar11 == (char *)0x0) {
            std::ios::clear((int)auStack_3f8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0xd8)
            ;
          }
          else {
            sVar8 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar11,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
          goto LAB_00d9c96e;
        }
      }
      else if (iVar4 == 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"uniform ",8);
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)auStack_3f8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0xd8);
        }
        else {
          sVar8 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar11,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ref_",5);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)auStack_3f8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0xd8);
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,";\n",2);
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)auStack_3f8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0xd8);
        }
        else {
          sVar8 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar11,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
LAB_00d9c96e:
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)auStack_3f8 + (int)*(_func_int **)(local_320._0_8_ + -0x18) + 0xd8);
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,";\n",2);
      }
      lVar14 = lVar14 + 1;
      pVVar16 = (local_3c8->values).
                super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x48;
    } while (lVar14 < (int)((ulong)((long)(local_3c8->values).
                                          super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar16
                                   ) >> 3) * 0x38e38e39);
  }
  local_380._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_380._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_380._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_380._M_impl.super__Rb_tree_header._M_header;
  local_380._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_380._M_impl.super__Rb_tree_header._M_header._M_right =
       local_380._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::stringbuf::str();
  paVar3 = &local_3f0.field_2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[22],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3c0,(char (*) [22])"FRAGMENT_DECLARATIONS",&local_3f0);
  psVar17 = local_338;
  paVar1 = &local_3c0.second.field_2;
  paVar2 = &local_3c0.first.field_2;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_380,&local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.second._M_dataplus._M_p,
                    local_3c0.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c0.first._M_dataplus._M_p,
                    local_3c0.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3c0,(char (*) [16])"FRAGMENT_OUTPUT",&local_3f0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_380,&local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.second._M_dataplus._M_p,
                    local_3c0.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c0.first._M_dataplus._M_p,
                    local_3c0.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[11],_const_char_*&,_true>(&local_3c0,(char (*) [11])0x1b7d15b,&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_380,&local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_3c0.second._M_dataplus._M_p,
                    local_3c0.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_3c0.first._M_dataplus._M_p,
                    local_3c0.first.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,local_340,&local_3c9);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_3c0,&local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::specialize
            (&local_3f0,(StringTemplate *)&local_3c0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_380);
  std::__cxx11::string::operator=((string *)psVar17,(string *)&local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_3c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_380);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  return;
}

Assistant:

void ShaderCase::specializeShaders(const char* vertexSource, const char* fragmentSource, string& outVertexSource,
								   string& outFragmentSource, const ValueBlock& valueBlock)
{
	const bool usesInout	  = usesShaderInoutQualifiers(m_targetVersion);
	const bool customColorOut = usesInout;

	// Vertex shader specialization.
	{
		ostringstream decl;
		ostringstream setup;
		const char*   vtxIn = usesInout ? "in" : "attribute";

		decl << vtxIn << " highp vec4 dEQP_Position;\n";

		for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
		{
			const ShaderCase::Value& val	 = valueBlock.values[ndx];
			const char*				 typeStr = getDataTypeName(val.dataType);

			if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
			{
				if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				{
					decl << vtxIn << " " << typeStr << " " << val.valueName << ";\n";
				}
				else
				{
					DataType	floatType	= getDataTypeFloatScalars(val.dataType);
					const char* floatTypeStr = getDataTypeName(floatType);

					decl << vtxIn << " " << floatTypeStr << " a_" << val.valueName << ";\n";
					setup << typeStr << " " << val.valueName << " = " << typeStr << "(a_" << val.valueName << ");\n";
				}
			}
			else if (val.storageType == ShaderCase::Value::STORAGE_UNIFORM && val.valueName.find('.') == string::npos)
			{
				decl << "uniform " << typeStr << " " << val.valueName << ";\n";
			}
		}

		map<string, string> params;
		params.insert(pair<string, string>("VERTEX_DECLARATIONS", decl.str()));
		params.insert(pair<string, string>("VERTEX_SETUP", setup.str()));
		params.insert(pair<string, string>("VERTEX_OUTPUT", string("gl_Position = dEQP_Position;\n")));
		StringTemplate tmpl(vertexSource);
		outVertexSource = tmpl.specialize(params);
	}

	// Fragment shader specialization.
	{
		ostringstream decl;
		ostringstream output;
		const char*   fragColor = customColorOut ? "dEQP_FragColor" : "gl_FragColor";

		genCompareFunctions(decl, valueBlock, false);
		genCompareOp(output, fragColor, valueBlock, "", DE_NULL);

		if (customColorOut)
			decl << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";

		for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
		{
			const ShaderCase::Value& val		= valueBlock.values[ndx];
			const char*				 valueName  = val.valueName.c_str();
			const char*				 refTypeStr = getDataTypeName(val.dataType);

			if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
			{
				decl << "uniform " << refTypeStr << " ref_" << valueName << ";\n";
				decl << refTypeStr << " " << valueName << ";\n";
			}
			else if (val.storageType == ShaderCase::Value::STORAGE_UNIFORM && val.valueName.find('.') == string::npos)
			{
				decl << "uniform " << refTypeStr << " " << valueName << ";\n";
			}
		}

		map<string, string> params;
		params.insert(pair<string, string>("FRAGMENT_DECLARATIONS", decl.str()));
		params.insert(pair<string, string>("FRAGMENT_OUTPUT", output.str()));
		params.insert(pair<string, string>("FRAG_COLOR", fragColor));
		StringTemplate tmpl(fragmentSource);
		outFragmentSource = tmpl.specialize(params);
	}
}